

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall Liby::TcpServer::start(TcpServer *this)

{
  int iVar1;
  element_type *this_00;
  pointer this_01;
  Channel *pCVar2;
  anon_class_8_1_8991fb9c local_78;
  BasicHandler local_70;
  anon_class_8_1_8991fb9c local_40;
  BasicHandler local_38;
  unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> local_18;
  TcpServer *local_10;
  TcpServer *this_local;
  
  local_10 = this;
  this_00 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->socket_);
  iVar1 = Socket::fd(this_00);
  this->listenfd_ = iVar1;
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_18,(int *)&this->poller_);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator=
            (&this->chan_,&local_18);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr(&local_18);
  this_01 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                      (&this->chan_);
  pCVar2 = Channel::enableRead(this_01,true);
  local_40.this = this;
  std::function<void()>::function<Liby::TcpServer::start()::__0,void>
            ((function<void()> *)&local_38,&local_40);
  pCVar2 = Channel::onRead(pCVar2,&local_38);
  local_78.this = this;
  std::function<void()>::function<Liby::TcpServer::start()::__1,void>
            ((function<void()> *)&local_70,&local_78);
  pCVar2 = Channel::onErro(pCVar2,&local_70);
  Channel::addChannel(pCVar2);
  std::function<void_()>::~function(&local_70);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void TcpServer::start() {
    listenfd_ = socket_->fd();
    chan_ = std::make_unique<Channel>(poller_, listenfd_);
    chan_->enableRead()
        .onRead([this] { handleAcceptEvent(); })
        .onErro([this] { handleErroEvent(); })
        .addChannel();
}